

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TestSpec::NamePattern::NamePattern(NamePattern *this,string *name,string *filterString)

{
  pointer pcVar1;
  string local_40;
  
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR__Pattern_001a8630;
  (this->super_Pattern).m_name._M_dataplus._M_p = (pointer)&(this->super_Pattern).m_name.field_2;
  pcVar1 = (filterString->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Pattern).m_name,pcVar1,pcVar1 + filterString->_M_string_length)
  ;
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR__NamePattern_001a8658;
  toLower(&local_40,name);
  WildcardPattern::WildcardPattern(&this->m_wildcardPattern,&local_40,No);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

TestSpec::NamePattern::NamePattern( std::string const& name, std::string const& filterString )
    : Pattern( filterString )
    , m_wildcardPattern( toLower( name ), CaseSensitive::No )
    {}